

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O1

void __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoLinear>::HDivDirectionsMaster
          (TPZGeoElRefLess<pzgeom::TPZGeoLinear> *this,TPZFMatrix<double> *directions)

{
  TPZFNMatrix<9,_double> gradx;
  TPZFMatrix<double> local_f0;
  double local_60 [10];
  
  local_f0.fElem = local_60;
  local_f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
  local_f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
  local_f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_f0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0183dbe0;
  local_f0.fSize = 9;
  local_f0.fGiven = local_f0.fElem;
  TPZVec<int>::TPZVec(&local_f0.fPivot.super_TPZVec<int>,0);
  local_f0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_f0.fPivot.super_TPZVec<int>.fStore = local_f0.fPivot.fExtAlloc;
  local_f0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_f0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_f0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_f0.fWork.fStore = (double *)0x0;
  local_f0.fWork.fNElements = 0;
  local_f0.fWork.fNAlloc = 0;
  local_f0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_0183d8f0;
  TPZFMatrix<double>::operator=(&local_f0,0.0);
  if ((0 < local_f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow) &&
     (0 < local_f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol)) {
    *local_f0.fElem = 1.0;
    pztopology::TPZLine::ComputeHDivDirections<double>(&local_f0,directions);
    TPZFMatrix<double>::~TPZFMatrix(&local_f0,&PTR_PTR_0183dba8);
    return;
  }
  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h",
             0x26d);
}

Assistant:

void TPZGeoElRefLess<TGeo>::HDivDirectionsMaster(TPZFMatrix<REAL> &directions)
{
    TPZFNMatrix<9,REAL> gradx(3,TGeo::Dimension,0.);
    for (int i = 0; i < TGeo::Dimension; i++) {
        gradx(i,i) = 1.;
    }
    TGeo::ComputeHDivDirections(gradx, directions);
}